

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::STA_ZP_X(CPU *this)

{
  uint uVar1;
  
  this->cycles = 4;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  (*this->memory->_vptr_MemoryBus[3])
            (this->memory,(ulong)((uint)this->X + (uVar1 & 0xff)),(ulong)this->A);
  this->cycles = this->cycles - 2;
  return;
}

Assistant:

void CPU::STA_ZP_X()
{
    cycles = 4;
    WriteByte(GetByte() + X, A);
    cycles--;
}